

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O3

void Pa_Sleep(long msec)

{
  bool bVar1;
  ulong uVar2;
  
  uVar2 = msec;
  if (999 < msec) {
    do {
      usleep(0xf3e58);
      msec = uVar2 - 999;
      bVar1 = 0x7ce < uVar2;
      uVar2 = msec;
    } while (bVar1);
  }
  usleep((int)msec * 1000);
  return;
}

Assistant:

void Pa_Sleep( long msec )
{
#ifdef HAVE_NANOSLEEP
    struct timespec req = {0}, rem = {0};
    PaTime time = msec / 1.e3;
    req.tv_sec = (time_t)time;
    assert(time - req.tv_sec < 1.0);
    req.tv_nsec = (long)((time - req.tv_sec) * 1.e9);
    nanosleep(&req, &rem);
    /* XXX: Try sleeping the remaining time (contained in rem) if interrupted by a signal? */
#else
    while( msec > 999 )     /* For OpenBSD and IRIX, argument */
        {                   /* to usleep must be < 1000000.   */
        usleep( 999000 );
        msec -= 999;
        }
    usleep( msec * 1000 );
#endif
}